

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiments.cpp
# Opt level: O1

void IFLT(ffe_t *data,uint size,uint index)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ffe_t fVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  ushort uVar10;
  
  if (1 < size) {
    uVar7 = 1;
    do {
      uVar8 = 0;
      uVar6 = uVar7;
      do {
        if (uVar6 - uVar7 < uVar6) {
          uVar1 = skewVec[(index - 1) + uVar6];
          lVar9 = 0;
          do {
            uVar5 = uVar6 + (int)lVar9;
            uVar2 = data[uVar8 + lVar9];
            uVar3 = data[uVar5];
            uVar10 = uVar3 ^ uVar2;
            data[uVar5] = uVar10;
            if (uVar1 != 0xffff) {
              if (uVar3 == uVar2) {
                fVar4 = 0;
              }
              else {
                uVar5 = (uint)GFLog[uVar10] + (uint)uVar1;
                fVar4 = GFExp[(uVar5 >> 0x10) + uVar5 & 0xffff];
              }
              data[uVar8 + lVar9] = data[uVar8 + lVar9] ^ fVar4;
            }
            lVar9 = lVar9 + 1;
          } while (uVar6 - uVar8 != lVar9);
        }
        uVar6 = uVar6 + uVar7 * 2;
        uVar8 = (ulong)((int)uVar8 + uVar7 * 2);
      } while (uVar6 < size);
      uVar7 = uVar7 * 2;
    } while (uVar7 < size);
  }
  return;
}

Assistant:

static void IFLT(ffe_t* data, const unsigned size, const unsigned index)
{
    for (unsigned width = 1; width < size; width <<= 1)
    {
        for (unsigned j = width; j < size; j += (width << 1))
        {
            const ffe_t skew = skewVec[j + index - 1];

            for (unsigned i = j - width; i < j; ++i)
                ifft_butterfly(data[i], data[i + width], skew);
        }
    }
}